

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int64_t cfl_compute_rd(AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,BLOCK_SIZE plane_bsize,
                      int cfl_idx,int fast_mode,RD_STATS *rd_stats)

{
  undefined1 uVar1;
  undefined1 uVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined1 in_CL;
  int in_EDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int in_stack_00000008;
  RD_STATS *in_stack_00000010;
  int64_t cfl_cost;
  uint8_t orig_cfl_alpha_idx;
  int in_stack_0000003c;
  int8_t orig_cfl_alpha_signs;
  int dummy_sign;
  int cfl_alpha;
  CFL_SIGN_TYPE cfl_sign;
  int64_t in_stack_00000048;
  int cfl_plane;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  BLOCK_SIZE in_stack_00000070;
  int in_stack_00000088;
  undefined4 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff84;
  int64_t local_58;
  int local_44;
  CFL_SIGN_TYPE local_3d;
  uint local_3c;
  long local_38;
  RefCntBuffer **local_30;
  int use_hadamard;
  TX_SIZE in_stack_ffffffffffffffe2;
  BLOCK_SIZE in_stack_ffffffffffffffe3;
  undefined2 in_stack_ffffffffffffffe8;
  
  use_hadamard = (int)((ulong)(in_RDI + 0x3bf80) >> 0x20);
  local_30 = in_RSI->ref_frame_map;
  local_38 = *(long *)(in_RSI->quant_params).gqmatrix[0][1][0xb];
  bVar3 = get_cfl_pred_type(in_EDX);
  local_3c = (uint)bVar3;
  cfl_idx_to_sign_and_alpha(in_R9D,&local_3d,&local_44);
  uVar1 = *(undefined1 *)(local_38 + 0x5c);
  uVar2 = *(undefined1 *)(local_38 + 0x5d);
  if (local_3c == 0) {
    cVar4 = local_3d * '\x03';
  }
  else {
    cVar4 = local_3d + '\x02';
  }
  *(char *)(local_38 + 0x5c) = cVar4;
  *(char *)(local_38 + 0x5d) = (char)(local_44 << 4) + (char)local_44;
  if (in_stack_00000008 == 0) {
    av1_init_rd_stats(in_stack_00000010);
    uVar5 = (uint)in_R8B;
    av1_txfm_rd_in_plane
              ((MACROBLOCK *)cm,(AV1_COMP *)xd,(RD_STATS *)mbmi,in_stack_00000048,_dummy_sign,
               in_stack_0000003c,in_stack_00000070,(TX_SIZE)x,(FAST_TX_SEARCH_MODE)cpi,
               in_stack_00000088);
    av1_rd_cost_update(in_stack_ffffffffffffff84,
                       (RD_STATS *)CONCAT44(in_stack_ffffffffffffff7c,uVar5));
    local_58 = in_stack_00000010->rdcost;
  }
  else {
    local_58 = intra_model_rd(in_RSI,(MACROBLOCK *)
                                     CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,
                                                  in_stack_ffffffffffffffe8))),in_R9D,
                              in_stack_ffffffffffffffe3,in_stack_ffffffffffffffe2,use_hadamard);
  }
  *(undefined1 *)(local_38 + 0x5c) = uVar1;
  *(undefined1 *)(local_38 + 0x5d) = uVar2;
  return local_58;
}

Assistant:

static int64_t cfl_compute_rd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              int plane, TX_SIZE tx_size,
                              BLOCK_SIZE plane_bsize, int cfl_idx,
                              int fast_mode, RD_STATS *rd_stats) {
  assert(IMPLIES(fast_mode, rd_stats == NULL));
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int cfl_plane = get_cfl_pred_type(plane);
  CFL_SIGN_TYPE cfl_sign;
  int cfl_alpha;
  cfl_idx_to_sign_and_alpha(cfl_idx, &cfl_sign, &cfl_alpha);
  // We conly build CFL for a given plane, the other plane's sign is dummy
  int dummy_sign = CFL_SIGN_NEG;
  const int8_t orig_cfl_alpha_signs = mbmi->cfl_alpha_signs;
  const uint8_t orig_cfl_alpha_idx = mbmi->cfl_alpha_idx;
  mbmi->cfl_alpha_signs =
      PLANE_SIGN_TO_JOINT_SIGN(cfl_plane, cfl_sign, dummy_sign);
  mbmi->cfl_alpha_idx = (cfl_alpha << CFL_ALPHABET_SIZE_LOG2) + cfl_alpha;
  int64_t cfl_cost;
  if (fast_mode) {
    cfl_cost =
        intra_model_rd(cm, x, plane, plane_bsize, tx_size, /*use_hadamard=*/0);
  } else {
    av1_init_rd_stats(rd_stats);
    av1_txfm_rd_in_plane(x, cpi, rd_stats, INT64_MAX, 0, plane, plane_bsize,
                         tx_size, FTXS_NONE, 0);
    av1_rd_cost_update(x->rdmult, rd_stats);
    cfl_cost = rd_stats->rdcost;
  }
  mbmi->cfl_alpha_signs = orig_cfl_alpha_signs;
  mbmi->cfl_alpha_idx = orig_cfl_alpha_idx;
  return cfl_cost;
}